

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O1

void Abc_FrameSetJsonObjs(Vec_Wec_t *vObjs)

{
  Vec_Wec_t *__ptr;
  void *__ptr_00;
  Abc_Frame_t *pAVar1;
  long lVar2;
  long lVar3;
  
  pAVar1 = s_GlobalFrame;
  __ptr = s_GlobalFrame->vJsonObjs;
  if (__ptr != (Vec_Wec_t *)0x0) {
    if (0 < __ptr->nCap) {
      lVar2 = 8;
      lVar3 = 0;
      do {
        __ptr_00 = *(void **)((long)&__ptr->pArray->nCap + lVar2);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
          *(undefined8 *)((long)&__ptr->pArray->nCap + lVar2) = 0;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x10;
      } while (lVar3 < __ptr->nCap);
    }
    if (__ptr->pArray != (Vec_Int_t *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (Vec_Int_t *)0x0;
    }
    __ptr->nCap = 0;
    __ptr->nSize = 0;
    free(__ptr);
    pAVar1->vJsonObjs = (Vec_Wec_t *)0x0;
  }
  pAVar1->vJsonObjs = vObjs;
  return;
}

Assistant:

void        Abc_FrameSetJsonObjs( Vec_Wec_t * vObjs )        { Vec_WecFreeP(&s_GlobalFrame->vJsonObjs ); s_GlobalFrame->vJsonObjs = vObjs; }